

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void readSocket(int sockfd,char *msg)

{
  ssize_t sVar1;
  uint32_t local_20;
  uint local_1c;
  int dim;
  int ret;
  char *msg_local;
  int sockfd_local;
  
  _dim = msg;
  msg_local._4_4_ = sockfd;
  sVar1 = recv(sockfd,&local_20,4,0x100);
  local_1c = (uint)sVar1;
  if (((int)local_1c < 0) || (local_1c < 4)) {
    perror_die("recv(dim)");
  }
  local_20 = ntohl(local_20);
  sVar1 = recv(msg_local._4_4_,_dim,(long)(int)local_20,0x100);
  local_1c = (uint)sVar1;
  if (((int)local_1c < 0) || ((int)local_1c < (int)local_20)) {
    perror_die("recv(msg)");
  }
  return;
}

Assistant:

void
readSocket(int sockfd, char* msg)
{
    int ret;    // return value
    int dim;    // dimension

    // receive and assign return value to ret for later check
    ret = recv(sockfd, (void*) &dim, sizeof(dim), MSG_WAITALL); // blocking function

    // check ret value
    if (ret < 0 || ret < sizeof(dim)) {
        perror_die("recv(dim)");
    }

    // endianess translation: network2host long
    dim = ntohl(dim);

    #if 0
        // clean data struct, causes a warning so i clean it in the main routine.
        memset(msg, '\0', sizeof(msg));
        // ./utils.h:162:34: warning: 'memset' call operates on objects of type 'char' while the size is based on a different type 'char *' [-Wsizeof-pointer-memaccess]
    #endif

    // get actual data from socket
    ret = recv(sockfd, (void*) msg, dim, MSG_WAITALL);

    // again, check return value
    if (ret < 0 || ret < dim) {
        perror_die("recv(msg)");
    }

    return;
}